

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::anon_unknown_0::node_output_attributes
               (xml_buffered_writer *writer,xml_node_struct *node,char_t *indent,
               size_t indent_length,uint flags,uint depth)

{
  ulong uVar1;
  char *data;
  xml_attribute_struct *pxVar2;
  char cVar3;
  
  pxVar2 = node->first_attribute;
  if (pxVar2 != (xml_attribute_struct *)0x0) {
    cVar3 = ((flags >> 9 & 1) != 0) * '\x05' + '\"';
    do {
      if ((flags & 0x44) == 0x40) {
        uVar1 = writer->bufsize;
        if (0x7ff < uVar1) {
          xml_buffered_writer::flush(writer,writer->buffer,uVar1);
          writer->bufsize = 0;
          uVar1 = 0;
        }
        writer->buffer[uVar1] = '\n';
        writer->bufsize = uVar1 + 1;
        text_output_indent(writer,indent,indent_length,depth + 1);
      }
      else {
        uVar1 = writer->bufsize;
        if (0x7ff < uVar1) {
          xml_buffered_writer::flush(writer,writer->buffer,uVar1);
          writer->bufsize = 0;
          uVar1 = 0;
        }
        writer->buffer[uVar1] = ' ';
        writer->bufsize = uVar1 + 1;
      }
      data = pxVar2->name;
      if (data == (char_t *)0x0) {
        data = ":anonymous";
      }
      xml_buffered_writer::write_string(writer,data);
      uVar1 = writer->bufsize;
      if (0x7fe < uVar1) {
        xml_buffered_writer::flush(writer,writer->buffer,uVar1);
        writer->bufsize = 0;
        uVar1 = 0;
      }
      writer->buffer[uVar1] = '=';
      writer->buffer[uVar1 + 1] = cVar3;
      writer->bufsize = uVar1 + 2;
      if (pxVar2->value != (char_t *)0x0) {
        text_output(writer,pxVar2->value,ctx_special_attr,flags);
      }
      uVar1 = writer->bufsize;
      if (0x7ff < uVar1) {
        xml_buffered_writer::flush(writer,writer->buffer,uVar1);
        writer->bufsize = 0;
        uVar1 = 0;
      }
      writer->buffer[uVar1] = cVar3;
      writer->bufsize = uVar1 + 1;
      pxVar2 = pxVar2->next_attribute;
    } while (pxVar2 != (xml_attribute_struct *)0x0);
  }
  return;
}

Assistant:

PUGI__FN void node_output_attributes(xml_buffered_writer& writer, xml_node_struct* node, const char_t* indent, size_t indent_length, unsigned int flags, unsigned int depth)
	{
		const char_t* default_name = PUGIXML_TEXT(":anonymous");
		const char_t enquotation_char = (flags & format_attribute_single_quote) ? '\'' : '"';

		for (xml_attribute_struct* a = node->first_attribute; a; a = a->next_attribute)
		{
			if ((flags & (format_indent_attributes | format_raw)) == format_indent_attributes)
			{
				writer.write('\n');

				text_output_indent(writer, indent, indent_length, depth + 1);
			}
			else
			{
				writer.write(' ');
			}

			writer.write_string(a->name ? a->name + 0 : default_name);
			writer.write('=', enquotation_char);

			if (a->value)
				text_output(writer, a->value, ctx_special_attr, flags);

			writer.write(enquotation_char);
		}
	}